

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectorclock.h
# Opt level: O1

void __thiscall
VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_>::update
          (VectorClock<std::allocator<std::pair<const_unsigned_long,_unsigned_long>_>_> *this,
          TID tid,VC_ID id)

{
  iterator iVar1;
  uint local_54;
  uint local_50 [2];
  VC_ID local_48;
  _Head_base<0UL,_unsigned_int_&&,_false> local_40;
  _Head_base<0UL,_unsigned_long_&&,_false> local_38;
  pair<phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>::iterator,_bool>
  local_30;
  
  local_54 = tid;
  iVar1 = phmap::container_internal::
          raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
          ::find<unsigned_int>
                    ((raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
                      *)this,&local_54,
                     SUB168(ZEXT416(tid) * ZEXT816(0xde5fb9d2630458e9),8) +
                     SUB168(ZEXT416(tid) * ZEXT816(0xde5fb9d2630458e9),0));
  if (iVar1.ctrl_ ==
      (this->vc).
      super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .
      super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
      .ctrl_ + (this->vc).
               super_raw_hash_map<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .
               super_raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,_unsigned_long>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_long>_>_>
               .capacity_) {
    local_38._M_head_impl = &local_48;
    local_50[0] = local_54;
    local_40._M_head_impl = local_50;
    local_48 = id;
    phmap::container_internal::
    raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
    ::
    emplace_decomposable<unsigned_int,std::piecewise_construct_t_const&,std::tuple<unsigned_int&&>,std::tuple<unsigned_long&&>>
              (&local_30,
               (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_int,unsigned_long>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_long>>>
                *)this,local_40._M_head_impl,
               SUB168(ZEXT416(local_54) * ZEXT816(0xde5fb9d2630458e9),8) +
               SUB168(ZEXT416(local_54) * ZEXT816(0xde5fb9d2630458e9),0),
               (piecewise_construct_t *)&std::piecewise_construct,
               (tuple<unsigned_int_&&> *)&local_40,(tuple<unsigned_long_&&> *)&local_38);
  }
  else if (*(ulong *)((long)iVar1.field_1.slot_ + 8) < id) {
    *(VC_ID *)((long)iVar1.field_1.slot_ + 8) = id;
  }
  return;
}

Assistant:

void update(TID tid, VC_ID id) {
    auto it = vc.find(tid);
    if (it == vc.end()) {
      vc.insert({tid, id});
    } else {
      if (it->second < id) {
        it->second = id;
      }
    }
  }